

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

int python2Present(void)

{
  undefined4 in_EAX;
  int iVar1;
  int i;
  char *in_stack_00000818;
  undefined8 uStack_8;
  
  if (python2Present::lPython2Present < 0) {
    python2Present::lPython2Present = 0;
    strcpy(gPython2Name,"python2");
    iVar1 = detectPresence(in_stack_00000818);
    if (iVar1 == 0) {
      uStack_8 = CONCAT44(9,in_EAX);
      while (-1 < uStack_8) {
        sprintf(gPython2Name,"python2.%d",(ulong)uStack_8._4_4_);
        iVar1 = detectPresence(in_stack_00000818);
        if (iVar1 != 0) {
          python2Present::lPython2Present = 1;
          break;
        }
        uStack_8 = CONCAT44(uStack_8._4_4_ - 1,(undefined4)uStack_8);
      }
    }
    else {
      python2Present::lPython2Present = 1;
    }
    if (tinyfd_verbose != 0) {
      printf("lPython2Present %d\n",(ulong)(uint)python2Present::lPython2Present);
    }
    if (tinyfd_verbose != 0) {
      printf("gPython2Name %s\n",gPython2Name);
    }
  }
  return python2Present::lPython2Present;
}

Assistant:

static int python2Present(void)
{
	static int lPython2Present = -1 ;
	int i;

	if ( lPython2Present < 0 )
	{
		lPython2Present = 0 ;
		strcpy(gPython2Name , "python2" ) ;
		if ( detectPresence(gPython2Name) ) lPython2Present = 1;
		else
		{
			for ( i = 9 ; i >= 0 ; i -- )
			{
				sprintf( gPython2Name , "python2.%d" , i ) ;
				if ( detectPresence(gPython2Name) )
				{
					lPython2Present = 1;
					break;
				}
			}
		}
		if (tinyfd_verbose) printf("lPython2Present %d\n", lPython2Present) ;
		if (tinyfd_verbose) printf("gPython2Name %s\n", gPython2Name) ;
	}
	return lPython2Present ;
}